

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O0

void * rw::gl3::createNativeRaster(void *object,int32 offset,int32 param_3)

{
  Gl3Raster *ras;
  int32 param_2_local;
  int32 offset_local;
  void *object_local;
  
  *(undefined4 *)((long)object + (long)offset + 0x10) = 0;
  *(undefined4 *)((long)object + (long)offset + 0x20) = 0;
  *(undefined8 *)((long)object + (long)offset + 0x28) = 0;
  *(undefined8 *)((long)object + (long)offset + 0x30) = 0;
  return object;
}

Assistant:

static void*
createNativeRaster(void *object, int32 offset, int32)
{
	Gl3Raster *ras = PLUGINOFFSET(Gl3Raster, object, offset);
	ras->texid = 0;
	ras->fbo = 0;
	ras->fboMate = nil;
	ras->backingStore = nil;
	return object;
}